

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O0

void __thiscall HMatrix::compute_vecT_matB(HMatrix *this,double *vec,int *base,HVector *result)

{
  double dVar1;
  int iVar2;
  value_type vVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  int k;
  double value;
  int iCol;
  int i;
  double *resultArray;
  int *resultIndex;
  int resultCount;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar8;
  double local_48;
  int local_3c;
  int local_24;
  
  HVector::clear((HVector *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_24 = 0;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RCX + 8),0);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x20),0);
  for (local_3c = 0; local_3c < in_RDI[1]; local_3c = local_3c + 1) {
    iVar2 = *(int *)(in_RDX + (long)local_3c * 4);
    local_48 = 0.0;
    if (iVar2 < *in_RDI) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)iVar2);
      vVar3 = *pvVar6;
      while (iVar8 = vVar3,
            pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)(iVar2 + 1))
            , vVar3 < *pvVar6) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)iVar8);
        dVar1 = *(double *)(in_RSI + (long)*pvVar6 * 8);
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)iVar8);
        local_48 = dVar1 * *pvVar7 + local_48;
        vVar3 = iVar8 + 1;
      }
    }
    else {
      local_48 = *(double *)(in_RSI + (long)(iVar2 - *in_RDI) * 8);
    }
    if (1e-14 < ABS(local_48)) {
      pvVar5[local_3c] = local_48;
      pvVar4[local_24] = local_3c;
      local_24 = local_24 + 1;
    }
  }
  *(int *)(in_RCX + 4) = local_24;
  return;
}

Assistant:

void HMatrix::compute_vecT_matB(const double *vec, const int *base,
        HVector *result) {
    result->clear();
    int resultCount = 0;
    int *resultIndex = &result->index[0];
    double *resultArray = &result->array[0];
    for (int i = 0; i < numRow; i++) {
        int iCol = base[i];
        double value = 0;
        if (iCol < numCol) {
            for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++)
                value += vec[Aindex[k]] * Avalue[k];
        } else {
            value = vec[iCol - numCol];
        }
        if (fabs(value) > HSOL_CONST_TINY) {
            resultArray[i] = value;
            resultIndex[resultCount++] = i;
        }
    }
    result->count = resultCount;
}